

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen12dGPUResource_TestPlanarTile64CompressedResource_Test::TestBody
          (CTestGen12dGPUResource_TestPlanarTile64CompressedResource_Test *this)

{
  short sVar1;
  long lVar2;
  uint local_158 [2];
  GMM_REQ_OFFSET_INFO OffsetInfo;
  GMM_RESOURCE_INFO *ResourceInfo;
  TEST_BPP UVbpp;
  TEST_BPP Ybpp;
  GMM_RESOURCE_FORMAT fmt;
  GMM_RESOURCE_FORMAT *__end1;
  GMM_RESOURCE_FORMAT *__begin1;
  GMM_RESOURCE_FORMAT (*__range1) [4];
  GMM_RESOURCE_FORMAT Format [4];
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t TileSize [5] [2];
  CTestGen12dGPUResource_TestPlanarTile64CompressedResource_Test *this_local;
  
  memcpy(&gmmParams.MultiTileArch,&DAT_0022a130,0x28);
  memset(Format + 2,0,0x80);
  Format[2] = GMM_FORMAT_A4B4G4R4_UNORM;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams._0_8_ = gmmParams._0_8_ & 0xffffffdbfffeffff | 0x2400010000;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xffffffffffefffff | 0x100000);
  gmmParams.CpTag = 100;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth = 100;
  gmmParams.field_6.BaseWidth64._4_4_ = 1;
  gmmParams.Depth = 2;
  __range1 = (GMM_RESOURCE_FORMAT (*) [4])0x15e0000015d;
  Format[0] = GMM_FORMAT_P010;
  Format[1] = GMM_FORMAT_P016;
  __end1 = (GMM_RESOURCE_FORMAT *)&__range1;
  while( true ) {
    if (__end1 == Format + 2) {
      return;
    }
    Format[3] = *__end1;
    lVar2 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x80))();
    sVar1 = *(short *)(lVar2 + 0x1814 + (ulong)Format[3] * 0x14);
    if ((sVar1 != 8) && (sVar1 != 0x10)) break;
    gmmParams._0_8_ = gmmParams._0_8_ & 0xffffffdfffffffff | 0x2000000000;
    OffsetInfo.StdLayout.TileDepthPitch =
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))();
    memset(local_158,0,0x60);
    OffsetInfo.Slice = 1;
    local_158[1] = 1;
    local_158[0] = local_158[0] & 0xfffffff8 | 3;
    (**(code **)(*(long *)OffsetInfo.StdLayout.TileDepthPitch + 0x68))
              (OffsetInfo.StdLayout.TileDepthPitch,local_158);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,OffsetInfo.StdLayout.TileDepthPitch);
    __end1 = __end1 + 1;
  }
  return;
}

Assistant:

TEST_F(CTestGen12dGPUResource, TestPlanarTile64CompressedResource)
{

    const uint32_t TileSize[TEST_BPP_MAX][2] = {
    {256, 256}, {512, 128}, {512, 128}, {1024, 64}, {1024, 64}}; // TileYS

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.Flags.Gpu.MMC        = 1;
    //gmmParams.Flags.Gpu.CCS = 1;
    gmmParams.Flags.Gpu.UnifiedAuxSurface = 1;
    gmmParams.Flags.Info.MediaCompressed  = 1;
    gmmParams.BaseWidth64                 = 0x64;
    gmmParams.BaseHeight                  = 0x64;
    gmmParams.Depth                       = 0x1;
    gmmParams.ArraySize                   = 2;

    GMM_RESOURCE_FORMAT Format[4] = {GMM_FORMAT_NV12, GMM_FORMAT_NV21, GMM_FORMAT_P010, GMM_FORMAT_P016};
    for(auto fmt : Format)
    {
        gmmParams.Format = fmt; // 8bpp(NV12) , P016 (16bpp), P010 (16bpp), NV21(8bpp)

        TEST_BPP Ybpp, UVbpp;
        //could be accessed on CPU/app where UV plane bpp is double
        switch(pGmmULTClientContext->GetPlatformInfo().FormatTable[gmmParams.Format].Element.BitsPer)
        {
            case 8:
                Ybpp  = TEST_BPP_8;
                UVbpp = TEST_BPP_16;
                break;
            case 16:
                Ybpp  = TEST_BPP_16;
                UVbpp = TEST_BPP_32;
                break;
            default:
                return;
        }

        gmmParams.Flags.Gpu.UnifiedAuxSurface = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);
	
	GMM_REQ_OFFSET_INFO OffsetInfo = {};

        OffsetInfo.ReqLock             = 1;
        OffsetInfo.ReqRender           = 1;
        OffsetInfo.Plane               = GMM_PLANE_Y;
        OffsetInfo.ArrayIndex          = 1;
        OffsetInfo.ReqStdLayout        = 0;
        ResourceInfo->GetOffset(OffsetInfo);
         
	// ToDo: add verification
        //{ //separate Aux
        //    gmmParams.Flags.Gpu.UnifiedAuxSurface = 0;
	//    GMM_RESOURCE_INFO *AuxResourceInfo;
        //    AuxResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);
        //    EXPECT_EQ(ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS), AuxResourceInfo->G

        // add verification

        //{ //separate Aux
        //    gmmParams.Flags.Gpu.UnifiedAuxSurface = 0;

        //    GMM_RESOURCE_INFO *AuxResourceInfo;
        //    AuxResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        //    EXPECT_EQ(ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS), AuxResourceInfo->GetSizeSurface());

        //    pGmmULTClientContext->DestroyResInfoObject(AuxResourceInfo);
        //}

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}